

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O1

void __thiscall vera::Node::Node(Node *this)

{
  this->_vptr_Node = (_func_int **)&PTR__Node_003ecfd0;
  (this->childs).super__Vector_base<vera::Node_*,_std::allocator<vera::Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->childs).super__Vector_base<vera::Node_*,_std::allocator<vera::Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->childs).super__Vector_base<vera::Node_*,_std::allocator<vera::Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->bChange = true;
  (this->m_transformMatrix).value[0].field_0.x = 1.0;
  (this->m_transformMatrix).value[0].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  (this->m_transformMatrix).value[0].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
  *(undefined8 *)&(this->m_transformMatrix).value[0].field_3 = 0;
  (this->m_transformMatrix).value[1].field_1.y = 1.0;
  (this->m_transformMatrix).value[1].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
  (this->m_transformMatrix).value[1].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
  (this->m_transformMatrix).value[2].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
  (this->m_transformMatrix).value[2].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  (this->m_transformMatrix).value[2].field_2.z = 1.0;
  *(undefined8 *)&(this->m_transformMatrix).value[2].field_3 = 0;
  (this->m_transformMatrix).value[3].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  (this->m_transformMatrix).value[3].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
  (this->m_transformMatrix).value[3].field_3.w = 1.0;
  (this->m_position).field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  (this->m_position).field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  *(undefined8 *)&(this->m_position).field_2 = 0;
  (this->m_orientation).y = 0.0;
  (this->m_orientation).z = 0.0;
  *(undefined8 *)&(this->m_orientation).w = 0x3f8000003f800000;
  (this->m_scale).field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x3f800000;
  (this->m_scale).field_2 =
       (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)0x3f800000;
  return;
}

Assistant:

Node::Node(): 
    bChange(true),
    m_transformMatrix(1.0), 
    m_position(0.0),
    m_orientation(1.0, 0.0, 0.0, 0.0),
    m_scale(1.0) {
}